

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O0

PCRE2_SPTR8 set_table_bit(pcre2_real_code_8 *re,PCRE2_SPTR8 p,BOOL caseless,BOOL utf)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte local_2a [6];
  uint32_t uStack_24;
  PCRE2_UCHAR8 buff [6];
  uint32_t c;
  BOOL utf_local;
  BOOL caseless_local;
  PCRE2_SPTR8 p_local;
  pcre2_real_code_8 *re_local;
  
  pbVar3 = p + 1;
  bVar1 = *p;
  uStack_24 = (uint32_t)bVar1;
  re->start_bitmap[bVar1 >> 3] = re->start_bitmap[bVar1 >> 3] | (byte)(1 << (bVar1 & 7));
  _utf_local = pbVar3;
  if ((utf != 0) && (0xbf < uStack_24)) {
    if ((bVar1 & 0x20) == 0) {
      _utf_local = p + 2;
      uStack_24 = (uStack_24 & 0x1f) << 6 | *pbVar3 & 0x3f;
    }
    else if ((bVar1 & 0x10) == 0) {
      uStack_24 = (uStack_24 & 0xf) << 0xc | (*pbVar3 & 0x3f) << 6 | p[2] & 0x3f;
      _utf_local = p + 3;
    }
    else if ((bVar1 & 8) == 0) {
      uStack_24 = (uStack_24 & 7) << 0x12 | (*pbVar3 & 0x3f) << 0xc | (p[2] & 0x3f) << 6 |
                  p[3] & 0x3f;
      _utf_local = p + 4;
    }
    else if ((bVar1 & 4) == 0) {
      uStack_24 = (uStack_24 & 3) << 0x18 | (*pbVar3 & 0x3f) << 0x12 | (p[2] & 0x3f) << 0xc |
                  (p[3] & 0x3f) << 6 | p[4] & 0x3f;
      _utf_local = p + 5;
    }
    else {
      uStack_24 = (uStack_24 & 1) << 0x1e | (*pbVar3 & 0x3f) << 0x18 | (p[2] & 0x3f) << 0x12 |
                  (p[3] & 0x3f) << 0xc | (p[4] & 0x3f) << 6 | p[5] & 0x3f;
      _utf_local = p + 6;
    }
  }
  if (caseless != 0) {
    if (utf == 0) {
      uVar2 = re->tables[uStack_24 + 0x100] / 8;
      re->start_bitmap[(int)uVar2] =
           re->start_bitmap[(int)uVar2] | (byte)(1 << (re->tables[uStack_24 + 0x100] & 7));
    }
    else {
      uStack_24 = uStack_24 +
                  _pcre2_ucd_records_8
                  [(int)(uint)_pcre2_ucd_stage2_8
                              [(int)((uint)""[(int)(uStack_24 / 0x80)] * 0x80 + uStack_24 % 0x80)]].
                  other_case;
      buff._2_4_ = utf;
      _pcre2_ord2utf_8(uStack_24,local_2a);
      re->start_bitmap[(int)(local_2a[0] / 8)] =
           re->start_bitmap[(int)(local_2a[0] / 8)] | (byte)(1 << (local_2a[0] & 7));
    }
  }
  return _utf_local;
}

Assistant:

static PCRE2_SPTR
set_table_bit(pcre2_real_code *re, PCRE2_SPTR p, BOOL caseless, BOOL utf)
{
uint32_t c = *p++;   /* First code unit */
(void)utf;           /* Stop compiler warning when UTF not supported */

/* In 16-bit and 32-bit modes, code units greater than 0xff set the bit for
0xff. */

#if PCRE2_CODE_UNIT_WIDTH != 8
if (c > 0xff) SET_BIT(0xff); else
#endif

SET_BIT(c);

/* In UTF-8 or UTF-16 mode, pick up the remaining code units in order to find
the end of the character, even when caseless. */

#ifdef SUPPORT_UNICODE
if (utf)
  {
#if PCRE2_CODE_UNIT_WIDTH == 8
  if (c >= 0xc0) GETUTF8INC(c, p);
#elif PCRE2_CODE_UNIT_WIDTH == 16
  if ((c & 0xfc00) == 0xd800) GETUTF16INC(c, p);
#endif
  }
#endif  /* SUPPORT_UNICODE */

/* If caseless, handle the other case of the character. */

if (caseless)
  {
  if (utf)
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    PCRE2_UCHAR buff[6];
    c = UCD_OTHERCASE(c);
    (void)PRIV(ord2utf)(c, buff);
    SET_BIT(buff[0]);
#else  /* 16-bit or 32-bit mode */
    c = UCD_OTHERCASE(c);
    if (c > 0xff) SET_BIT(0xff); else SET_BIT(c);
#endif
    }

  /* Not UTF */

  else if (MAX_255(c)) SET_BIT(re->tables[fcc_offset + c]);
  }

return p;
}